

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O2

void __thiscall irr::io::CFileSystem::CFileSystem(CFileSystem *this)

{
  long lVar1;
  CArchiveLoaderZIP *this_00;
  CArchiveLoaderZIP *local_20;
  
  *(undefined8 *)&this->field_0x98 = 0;
  *(undefined4 *)&this->field_0xa0 = 1;
  (this->super_IFileSystem)._vptr_IFileSystem = (_func_int **)0x286a28;
  *(undefined8 *)&this->field_0x90 = 0x286b30;
  lVar1 = 0x20;
  do {
    *(long *)((long)this + lVar1 + -0x10) =
         (long)&(this->super_IFileSystem)._vptr_IFileSystem + lVar1;
    *(undefined8 *)((long)this + lVar1 + -8) = 0;
    *(undefined1 *)((long)&(this->super_IFileSystem)._vptr_IFileSystem + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x60);
  (this->ArchiveLoader).m_data.
  super__Vector_base<irr::io::IArchiveLoader_*,_std::allocator<irr::io::IArchiveLoader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ArchiveLoader).m_data.
  super__Vector_base<irr::io::IArchiveLoader_*,_std::allocator<irr::io::IArchiveLoader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ArchiveLoader).m_data.
  super__Vector_base<irr::io::IArchiveLoader_*,_std::allocator<irr::io::IArchiveLoader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ArchiveLoader).is_sorted = true;
  (this->FileArchives).m_data.
  super__Vector_base<irr::io::IFileArchive_*,_std::allocator<irr::io::IFileArchive_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FileArchives).m_data.
  super__Vector_base<irr::io::IFileArchive_*,_std::allocator<irr::io::IFileArchive_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FileArchives).m_data.
  super__Vector_base<irr::io::IFileArchive_*,_std::allocator<irr::io::IFileArchive_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FileArchives).is_sorted = true;
  *(undefined4 *)&(this->super_IFileSystem).field_0x8 = 0;
  getWorkingDirectory(this);
  this_00 = (CArchiveLoaderZIP *)operator_new(0x28);
  CArchiveLoaderZIP::CArchiveLoaderZIP(this_00,&this->super_IFileSystem);
  local_20 = this_00;
  core::array<irr::io::IArchiveLoader_*>::push_back
            (&this->ArchiveLoader,(IArchiveLoader **)&local_20);
  return;
}

Assistant:

CFileSystem::CFileSystem()
{
#ifdef _DEBUG
	setDebugName("CFileSystem");
#endif

	setFileListSystem(FILESYSTEM_NATIVE);
	//! reset current working directory
	getWorkingDirectory();

	ArchiveLoader.push_back(new CArchiveLoaderZIP(this));
}